

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpAttr(xmlDebugCtxtPtr ctxt,xmlAttrPtr attr)

{
  _xmlNode *node;
  
  xmlCtxtDumpSpaces(ctxt);
  if (attr != (xmlAttrPtr)0x0) {
    if (ctxt->check == 0) {
      fwrite("ATTRIBUTE ",10,1,(FILE *)ctxt->output);
      xmlCtxtDumpString(ctxt,attr->name);
      fputc(10,(FILE *)ctxt->output);
      node = attr->children;
      if (node != (_xmlNode *)0x0) {
        ctxt->depth = ctxt->depth + 1;
        do {
          xmlCtxtDumpNode(ctxt,node);
          node = node->next;
        } while (node != (_xmlNode *)0x0);
        ctxt->depth = ctxt->depth + -1;
      }
    }
    if (attr->name == (xmlChar *)0x0) {
      ctxt->errors = ctxt->errors + 1;
      fprintf((FILE *)ctxt->output,"ERROR %d: %s",0x1397,"Attribute has no name");
    }
    xmlCtxtGenericNodeCheck(ctxt,(xmlNodePtr)attr);
    return;
  }
  if (ctxt->check != 0) {
    return;
  }
  fwrite("Attr is NULL",0xc,1,(FILE *)ctxt->output);
  return;
}

Assistant:

static void
xmlCtxtDumpAttr(xmlDebugCtxtPtr ctxt, xmlAttrPtr attr)
{
    xmlCtxtDumpSpaces(ctxt);

    if (attr == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "Attr is NULL");
        return;
    }
    if (!ctxt->check) {
        fprintf(ctxt->output, "ATTRIBUTE ");
	xmlCtxtDumpString(ctxt, attr->name);
        fprintf(ctxt->output, "\n");
        if (attr->children != NULL) {
            ctxt->depth++;
            xmlCtxtDumpNodeList(ctxt, attr->children);
            ctxt->depth--;
        }
    }
    if (attr->name == NULL)
	xmlDebugErr(ctxt, XML_CHECK_NO_NAME,
	            "Attribute has no name");

    /*
     * Do a bit of checking
     */
    xmlCtxtGenericNodeCheck(ctxt, (xmlNodePtr) attr);
}